

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_create_ep(nn_sock *sock,char *addr,int bind)

{
  nn_transport *pnVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  undefined4 in_EDX;
  char *in_RSI;
  nn_transport *in_RDI;
  int i;
  nn_transport *tp;
  size_t protosz;
  char *delim;
  char *proto;
  int rc;
  int local_44;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  if (in_RSI == (char *)0x0) {
    iVar7 = -0x16;
  }
  else {
    sVar3 = strlen(in_RSI);
    if (sVar3 < 0x80) {
      pcVar5 = in_RSI;
      pcVar4 = strchr(in_RSI,0x3a);
      if (pcVar4 == (char *)0x0) {
        iVar7 = -0x16;
      }
      else if ((pcVar4[1] == '/') && (pcVar4[2] == '/')) {
        sVar3 = (long)pcVar4 - (long)pcVar5;
        pcVar5 = pcVar5 + sVar3 + 3;
        local_44 = 0;
        while( true ) {
          iVar7 = (int)((ulong)pcVar5 >> 0x20);
          pnVar1 = nn_transports[local_44];
          if (pnVar1 == (nn_transport *)0x0) break;
          sVar6 = strlen(pnVar1->name);
          if (sVar6 == sVar3) {
            iVar2 = memcmp(pnVar1->name,in_RSI,sVar3);
            iVar7 = (int)((ulong)pcVar5 >> 0x20);
            if (iVar2 == 0) break;
          }
          local_44 = local_44 + 1;
        }
        if (pnVar1 == (nn_transport *)0x0) {
          iVar7 = -0x5d;
        }
        else {
          iVar7 = nn_sock_add_ep((nn_sock *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,iVar7,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        }
      }
      else {
        iVar7 = -0x16;
      }
    }
    else {
      iVar7 = -0x24;
    }
  }
  return iVar7;
}

Assistant:

static int nn_global_create_ep (struct nn_sock *sock, const char *addr,
    int bind)
{
    int rc;
    const char *proto;
    const char *delim;
    size_t protosz;
    const struct nn_transport *tp;
    int i;

    /*  Check whether address is valid. */
    if (!addr)
        return -EINVAL;
    if (strlen (addr) >= NN_SOCKADDR_MAX)
        return -ENAMETOOLONG;

    /*  Separate the protocol and the actual address. */
    proto = addr;
    delim = strchr (addr, ':');
    if (!delim)
        return -EINVAL;
    if (delim [1] != '/' || delim [2] != '/')
        return -EINVAL;
    protosz = delim - addr;
    addr += protosz + 3;

    /*  Find the specified protocol. */
    tp = NULL;
    for (i = 0; ((tp = nn_transports[i]) != NULL); i++) {
        if (strlen (tp->name) == protosz &&
              memcmp (tp->name, proto, protosz) == 0)
            break;
    }

    /*  The protocol specified doesn't match any known protocol. */
    if (tp == NULL) {
        return -EPROTONOSUPPORT;
    }

    /*  Ask the socket to create the endpoint. */
    rc = nn_sock_add_ep (sock, tp, bind, addr);
    return rc;
}